

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::PerfectAggregateHashTable::Combine
          (PerfectAggregateHashTable *this,PerfectAggregateHashTable *other)

{
  shared_ptr<duckdb::TupleDataLayout,_true> *this_00;
  __uniq_ptr_impl<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_> __p;
  type pTVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t count;
  idx_t i;
  ulong uVar4;
  RowOperationsState row_state;
  __uniq_ptr_impl<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_> local_138;
  LogicalType local_130;
  LogicalType local_118;
  Vector target_addresses;
  Vector source_addresses;
  
  LogicalType::LogicalType(&local_118,POINTER);
  Vector::Vector(&source_addresses,&local_118,0x800);
  LogicalType::~LogicalType(&local_118);
  LogicalType::LogicalType(&local_130,POINTER);
  Vector::Vector(&target_addresses,&local_130,0x800);
  LogicalType::~LogicalType(&local_130);
  pdVar3 = other->data;
  pdVar2 = this->data;
  row_state.allocator =
       unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
       operator*(&this->aggregate_allocator);
  row_state.addresses.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
       (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)
       (__uniq_ptr_data<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true,_true>)0x0;
  this_00 = &(this->super_BaseAggregateHashTable).layout_ptr;
  count = 0;
  for (uVar4 = 0; uVar4 < this->total_groups; uVar4 = uVar4 + 1) {
    if ((other->group_is_set).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar4] == true) {
      (this->group_is_set).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar4] = true;
      *(data_ptr_t *)(source_addresses.data + count * 8) = pdVar3;
      *(data_ptr_t *)(target_addresses.data + count * 8) = pdVar2;
      count = count + 1;
      if (count == 0x800) {
        pTVar1 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(this_00);
        RowOperations::CombineStates(&row_state,pTVar1,&source_addresses,&target_addresses,0x800);
        count = 0;
      }
    }
    pdVar3 = pdVar3 + this->tuple_size;
    pdVar2 = pdVar2 + this->tuple_size;
  }
  pTVar1 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(this_00);
  RowOperations::CombineStates(&row_state,pTVar1,&source_addresses,&target_addresses,count);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
              *)&this->stored_allocators,&other->aggregate_allocator);
  make_uniq<duckdb::ArenaAllocator,duckdb::Allocator&>
            ((duckdb *)&local_138,(this->super_BaseAggregateHashTable).allocator);
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::ArenaAllocator_*,_std::default_delete<duckdb::ArenaAllocator>_>.
  super__Head_base<0UL,_duckdb::ArenaAllocator_*,_false>._M_head_impl =
       local_138._M_t.
       super__Tuple_impl<0UL,_duckdb::ArenaAllocator_*,_std::default_delete<duckdb::ArenaAllocator>_>
       .super__Head_base<0UL,_duckdb::ArenaAllocator_*,_false>._M_head_impl;
  local_138._M_t.
  super__Tuple_impl<0UL,_duckdb::ArenaAllocator_*,_std::default_delete<duckdb::ArenaAllocator>_>.
  super__Head_base<0UL,_duckdb::ArenaAllocator_*,_false>._M_head_impl =
       (tuple<duckdb::ArenaAllocator_*,_std::default_delete<duckdb::ArenaAllocator>_>)
       (_Tuple_impl<0UL,_duckdb::ArenaAllocator_*,_std::default_delete<duckdb::ArenaAllocator>_>)0x0
  ;
  ::std::__uniq_ptr_impl<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_>::
  reset((__uniq_ptr_impl<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_> *)
        &other->aggregate_allocator,
        (pointer)__p._M_t.
                 super__Tuple_impl<0UL,_duckdb::ArenaAllocator_*,_std::default_delete<duckdb::ArenaAllocator>_>
                 .super__Head_base<0UL,_duckdb::ArenaAllocator_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_>::
  ~unique_ptr((unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_> *)
              &local_138);
  ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
            (&row_state.addresses.
              super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>);
  Vector::~Vector(&target_addresses);
  Vector::~Vector(&source_addresses);
  return;
}

Assistant:

void PerfectAggregateHashTable::Combine(PerfectAggregateHashTable &other) {
	D_ASSERT(total_groups == other.total_groups);
	D_ASSERT(tuple_size == other.tuple_size);

	Vector source_addresses(LogicalType::POINTER);
	Vector target_addresses(LogicalType::POINTER);
	auto source_addresses_ptr = FlatVector::GetData<data_ptr_t>(source_addresses);
	auto target_addresses_ptr = FlatVector::GetData<data_ptr_t>(target_addresses);

	// iterate over all entries of both hash tables and call combine for all entries that can be combined
	data_ptr_t source_ptr = other.data;
	data_ptr_t target_ptr = data;
	idx_t combine_count = 0;
	RowOperationsState row_state(*aggregate_allocator);
	for (idx_t i = 0; i < total_groups; i++) {
		auto has_entry_source = other.group_is_set[i];
		// we only have any work to do if the source has an entry for this group
		if (has_entry_source) {
			group_is_set[i] = true;
			source_addresses_ptr[combine_count] = source_ptr;
			target_addresses_ptr[combine_count] = target_ptr;
			combine_count++;
			if (combine_count == STANDARD_VECTOR_SIZE) {
				RowOperations::CombineStates(row_state, *layout_ptr, source_addresses, target_addresses, combine_count);
				combine_count = 0;
			}
		}
		source_ptr += tuple_size;
		target_ptr += tuple_size;
	}
	RowOperations::CombineStates(row_state, *layout_ptr, source_addresses, target_addresses, combine_count);

	// FIXME: after moving the arena allocator, we currently have to ensure that the pointer is not nullptr, because the
	// FIXME: Destroy()-function of the hash table expects an allocator in some cases (e.g., for sorted aggregates)
	stored_allocators.push_back(std::move(other.aggregate_allocator));
	other.aggregate_allocator = make_uniq<ArenaAllocator>(allocator);
}